

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::KNearestNeighborsClassifier::ByteSizeLong(KNearestNeighborsClassifier *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  
  if (this->nearestneighborsindex_ == (NearestNeighborsIndex *)0x0 ||
      this == (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    sVar4 = 0;
  }
  else {
    sVar4 = NearestNeighborsIndex::ByteSizeLong(this->nearestneighborsindex_);
    uVar7 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->numberofneighbors_ != (Int64Parameter *)0x0 &&
      this != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    sVar5 = Int64Parameter::ByteSizeLong(this->numberofneighbors_);
    uVar7 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 0x65) {
    sVar5 = Int64Vector::ByteSizeLong((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[0] != 100) goto LAB_0046864e;
    sVar5 = StringVector::ByteSizeLong((this->ClassLabels_).stringclasslabels_);
  }
  uVar7 = (uint)sVar5 | 1;
  iVar2 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_0046864e:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x6f) {
    uVar8 = (this->DefaultClassLabel_).defaultint64label_ | 1;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar4 = sVar4 + (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
  }
  else if (uVar1 == 0x6e) {
    if (uVar1 != 0x6e) {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    else {
      puVar6 = (undefined8 *)(this->DefaultClassLabel_).defaultint64label_;
    }
    uVar7 = (uint)puVar6[1] | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + puVar6[1] + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  if ((this->_oneof_case_[2] == 0xd2) || (this->_oneof_case_[2] == 200)) {
    ((this->WeightingScheme_).uniformweighting_)->_cached_size_ = 0;
    sVar4 = sVar4 + 3;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t KNearestNeighborsClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.KNearestNeighborsClassifier)
  size_t total_size = 0;

  // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
  if (this->has_nearestneighborsindex()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->nearestneighborsindex_);
  }

  // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
  if (this->has_numberofneighbors()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->numberofneighbors_);
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  switch (DefaultClassLabel_case()) {
    // string defaultStringLabel = 110;
    case kDefaultStringLabel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->defaultstringlabel());
      break;
    }
    // int64 defaultInt64Label = 111;
    case kDefaultInt64Label: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  switch (WeightingScheme_case()) {
    // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
    case kUniformWeighting: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *WeightingScheme_.uniformweighting_);
      break;
    }
    // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
    case kInverseDistanceWeighting: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *WeightingScheme_.inversedistanceweighting_);
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}